

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RU_matrix.h
# Opt level: O2

void __thiscall
Gudhi::persistence_matrix::
RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_true,_true,_true>_>_>
::_reduce_column(RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_true,_true,_true>_>_>
                 *this,Index target,Index eventIndex)

{
  uint uVar1;
  node_ptr plVar2;
  Column *pCVar3;
  Index source;
  ulong uVar4;
  Column_support *pCVar5;
  
  pCVar3 = Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_true,_true,_true>_>_>
           ::get_column(&this->reducedMatrixR_,target);
  plVar2 = (pCVar3->column_).super_type.data_.root_plus_size_.m_header.super_node.next_;
  pCVar5 = &pCVar3->column_;
  uVar4 = 0xffffffff;
  source = 0xffffffff;
  if (plVar2 != (node_ptr)pCVar5 && plVar2 != (node_ptr)0x0) {
    uVar1 = *(uint *)&(pCVar3->column_).super_type.data_.root_plus_size_.m_header.super_node.prev_
                      [1].next_;
    uVar4 = 0xffffffff;
    source = 0xffffffff;
    if ((ulong)uVar1 != 0xffffffff) {
      source = (this->pivotToColumnIndex_).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar1];
      uVar4 = (ulong)uVar1;
    }
  }
  while( true ) {
    if ((ID_index)uVar4 == 0xffffffff) {
      RU_pairing<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_true,_true,_true>_>_>
      ::_add_bar((RU_pairing<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_true,_true,_true>_>_>
                  *)this,(this->reducedMatrixR_).matrix_.
                         super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_true,_true,_true>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[target].
                         super_Column_dimension_option.dim_,eventIndex);
      return;
    }
    if (source == 0xffffffff) break;
    _reduce_column_by(this,target,source);
    plVar2 = (pCVar5->super_type).data_.root_plus_size_.m_header.super_node.next_;
    uVar4 = 0xffffffff;
    source = 0xffffffff;
    if (plVar2 != (node_ptr)pCVar5 && plVar2 != (node_ptr)0x0) {
      uVar1 = *(uint *)&(pCVar3->column_).super_type.data_.root_plus_size_.m_header.super_node.prev_
                        [1].next_;
      uVar4 = 0xffffffff;
      source = 0xffffffff;
      if ((ulong)uVar1 != 0xffffffff) {
        source = (this->pivotToColumnIndex_).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar1];
        uVar4 = (ulong)uVar1;
      }
    }
  }
  (this->pivotToColumnIndex_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start[uVar4] = target;
  RU_pairing<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_true,_true,_true>_>_>
  ::_update_barcode((RU_pairing<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_true,_true,_true>_>_>
                     *)this,(ID_index)uVar4,eventIndex);
  return;
}

Assistant:

inline void RU_matrix<Master_matrix>::_reduce_column(Index target, Index eventIndex)
{
  auto get_column_with_pivot_ = [&](ID_index pivot) -> Index {
    if (pivot == Master_matrix::template get_null_value<ID_index>())
      return Master_matrix::template get_null_value<Index>();
    if constexpr (Master_matrix::Option_list::has_map_column_container) {
      auto it = pivotToColumnIndex_.find(pivot);
      if (it == pivotToColumnIndex_.end())
        return Master_matrix::template get_null_value<Index>();
      else
        return it->second;
    } else {
      return pivotToColumnIndex_[pivot];
    }
  };

  Column& curr = reducedMatrixR_.get_column(target);
  ID_index pivot = curr.get_pivot();
  Index currIndex = get_column_with_pivot_(pivot);

  while (pivot != Master_matrix::template get_null_value<ID_index>() &&
         currIndex != Master_matrix::template get_null_value<Index>()) {
    _reduce_column_by(target, currIndex);
    pivot = curr.get_pivot();
    currIndex = get_column_with_pivot_(pivot);
  }

  if (pivot != Master_matrix::template get_null_value<ID_index>()) {
    if constexpr (Master_matrix::Option_list::has_map_column_container) {
      pivotToColumnIndex_.try_emplace(pivot, target);
    } else {
      pivotToColumnIndex_[pivot] = target;
    }
    _update_barcode(pivot, eventIndex);
  } else {
    _add_bar(get_column_dimension(target), eventIndex);
  }
}